

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

bool P_TestActivateLine(line_t_conflict *line,AActor *mo,int side,int activationType,
                       DVector3 *optpos)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  TFlags<ActorFlag,_unsigned_int> local_44;
  bool noway;
  TFlags<ActorFlag4,_unsigned_int> local_3c;
  TFlags<ActorFlag,_unsigned_int> local_38;
  uint local_34;
  DVector3 *pDStack_30;
  int lineActivation;
  DVector3 *optpos_local;
  int activationType_local;
  int side_local;
  AActor *mo_local;
  line_t_conflict *line_local;
  
  local_34 = line->activation;
  if (((line->flags & 0x800000) != 0) && (side == 1)) {
    return false;
  }
  pDStack_30 = optpos;
  optpos_local._0_4_ = activationType;
  optpos_local._4_4_ = side;
  _activationType_local = mo;
  mo_local = (AActor *)line;
  if ((local_34 & 0x40) == 0) {
    bVar3 = false;
    if ((((line->special == 0x46) && (bVar3 = false, (local_34 & 1) != 0)) &&
        (bVar3 = false, activationType == 0x20)) && (bVar3 = false, mo != (AActor *)0x0)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_38,
                 (int)mo + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      bVar3 = uVar4 != 0;
    }
    if (bVar3) {
      local_34 = local_34 | 0x20;
    }
  }
  else {
    local_34 = local_34 | 2;
  }
  if ((local_34 & 0x80) != 0) {
    local_34 = local_34 | 5;
  }
  if ((((uint)optpos_local == 2) || ((uint)optpos_local == 0x400)) &&
     (bVar3 = P_CheckSwitchRange(_activationType_local,(line_t_conflict *)mo_local,
                                 optpos_local._4_4_,pDStack_30), !bVar3)) {
    return false;
  }
  bVar3 = false;
  if ((((uint)optpos_local == 2) && (bVar3 = false, (local_34 & 0x100) != 0)) &&
     (bVar3 = false, _activationType_local->player == (player_t *)0x0)) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_3c,
               (int)_activationType_local +
               (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
    bVar3 = uVar4 != 0;
  }
  if (bVar3) {
    return true;
  }
  bVar3 = false;
  if ((((uint)optpos_local == 0x10) && (bVar3 = false, (local_34 & 0x200) != 0)) &&
     (bVar3 = false, _activationType_local->player == (player_t *)0x0)) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)&stack0xffffffffffffffc0,
               (int)_activationType_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xffffffffffffffc0);
    bVar3 = uVar4 != 0;
  }
  if (bVar3) {
    return true;
  }
  if (((local_34 & (uint)optpos_local) == 0) && (((uint)optpos_local != 4 || (local_34 != 1)))) {
    return false;
  }
  if (((uint)optpos_local == 0x80) && ((local_34 & 0x80) != 0)) {
    return true;
  }
  bVar3 = false;
  if ((_activationType_local != (AActor *)0x0) &&
     (bVar3 = false, _activationType_local->player == (player_t *)0x0)) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_44,
               (int)_activationType_local +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
    bVar3 = false;
    if ((uVar4 == 0) &&
       (bVar3 = false, ((mo_local->super_DThinker).super_DObject.ObjectFlags & 0x2000) == 0)) {
      bVar3 = (uint)optpos_local != 4 || (local_34 & 4) == 0;
    }
  }
  if (!bVar3) {
    if ((((uint)optpos_local == 4) && ((local_34 & 4) == 0)) &&
       (((mo_local->super_DThinker).super_DObject.ObjectFlags & 0x2000) == 0)) {
      return false;
    }
    return true;
  }
  if ((level.flags2 & 4) == 0) {
    return false;
  }
  if ((((uint)optpos_local == 2) || ((uint)optpos_local == 0x10)) &&
     (((mo_local->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    return false;
  }
  bVar2 = 1;
  if ((uint)optpos_local != 2) {
    if ((uint)optpos_local == 4) {
      if ((local_34 & 4) == 0) {
        iVar1 = *(int *)&(mo_local->super_DThinker).NextThinker;
        if (iVar1 == 0xc) {
          if (0x3f < *(int *)&(mo_local->super_DThinker).PrevThinker) goto LAB_005fae13;
        }
        else if (((iVar1 != 0x3e) && (1 < iVar1 - 0x46U)) && ((iVar1 != 0xce && (iVar1 != 0xd7))))
        goto LAB_005fae13;
        bVar2 = 0;
      }
      else {
        bVar2 = 0;
      }
      goto LAB_005fae13;
    }
    if ((uint)optpos_local != 0x10) {
      bVar2 = 0;
      goto LAB_005fae13;
    }
  }
  iVar1 = *(int *)&(mo_local->super_DThinker).NextThinker;
  if (iVar1 == 0xc) {
    if ((*(int *)((long)&(mo_local->super_DThinker).NextThinker + 4) == 0) &&
       (*(int *)&(mo_local->super_DThinker).PrevThinker < 0x40)) {
      bVar2 = 0;
    }
  }
  else if (iVar1 - 0x46U < 2) {
    bVar2 = 0;
  }
LAB_005fae13:
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool P_TestActivateLine (line_t *line, AActor *mo, int side, int activationType, DVector3 *optpos)
{
 	int lineActivation = line->activation;

	if (line->flags & ML_FIRSTSIDEONLY && side == 1)
	{
		return false;
	}

	if (lineActivation & SPAC_UseThrough)
	{
		lineActivation |= SPAC_Use;
	}
	else if (line->special == Teleport &&
		(lineActivation & SPAC_Cross) &&
		activationType == SPAC_PCross &&
		mo != NULL &&
		mo->flags & MF_MISSILE)
	{ // Let missiles use regular player teleports
		lineActivation |= SPAC_PCross;
	}
	// BOOM's generalized line types that allow monster use can actually be
	// activated by anything except projectiles.
	if (lineActivation & SPAC_AnyCross)
	{
		lineActivation |= SPAC_Cross|SPAC_MCross;
	}
	if (activationType == SPAC_Use || activationType == SPAC_UseBack)
	{
		if (!P_CheckSwitchRange(mo, line, side, optpos))
		{
			return false;
		}
	}

	if (activationType == SPAC_Use && (lineActivation & SPAC_MUse) && !mo->player && mo->flags4 & MF4_CANUSEWALLS)
	{
		return true;
	}
	if (activationType == SPAC_Push && (lineActivation & SPAC_MPush) && !mo->player && mo->flags2 & MF2_PUSHWALL)
	{
		return true;
	}
	if ((lineActivation & activationType) == 0)
	{
		if (activationType != SPAC_MCross || lineActivation != SPAC_Cross)
		{ 
			return false;
		}
	}
	if (activationType == SPAC_AnyCross && (lineActivation & activationType))
	{
		return true;
	}
	if (mo && !mo->player &&
		!(mo->flags & MF_MISSILE) &&
		!(line->flags & ML_MONSTERSCANACTIVATE) &&
		(activationType != SPAC_MCross || (!(lineActivation & SPAC_MCross))))
	{ 
		// [RH] monsters' ability to activate this line depends on its type
		// In Hexen, only MCROSS lines could be activated by monsters. With
		// lax activation checks, monsters can also activate certain lines
		// even without them being marked as monster activate-able. This is
		// the default for non-Hexen maps in Hexen format.
		if (!(level.flags2 & LEVEL2_LAXMONSTERACTIVATION))
		{
			return false;
		}
		if ((activationType == SPAC_Use || activationType == SPAC_Push)
			&& (line->flags & ML_SECRET))
			return false;		// never open secret doors

		bool noway = true;

		switch (activationType)
		{
		case SPAC_Use:
		case SPAC_Push:
			switch (line->special)
			{
			case Door_Raise:
				if (line->args[0] == 0 && line->args[1] < 64)
					noway = false;
				break;
			case Teleport:
			case Teleport_NoFog:
				noway = false;
			}
			break;

		case SPAC_MCross:
			if (!(lineActivation & SPAC_MCross))
			{
				switch (line->special)
				{
				case Door_Raise:
					if (line->args[1] >= 64)
					{
						break;
					}
				case Teleport:
				case Teleport_NoFog:
				case Teleport_Line:
				case Plat_DownWaitUpStayLip:
				case Plat_DownWaitUpStay:
					noway = false;
				}
			}
			else noway = false;
			break;

		default:
			noway = false;
		}
		return !noway;
	}
	if (activationType == SPAC_MCross && !(lineActivation & SPAC_MCross) &&
		!(line->flags & ML_MONSTERSCANACTIVATE))
	{
		return false;
	}
	return true;
}